

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<128u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<128u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  undefined8 uVar4;
  value_type_conflict vVar5;
  undefined8 uVar6;
  unsigned_fast_type i;
  long lVar7;
  unsigned_fast_type uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  undefined7 in_register_00000011;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  uintwide_t<128U,_unsigned_int,_void,_false> t_1;
  uintwide_t<128U,_unsigned_int,_void,_false> tmp;
  uintwide_t<128U,_unsigned_int,_void,_false> local_b8;
  byte local_a8 [32];
  undefined8 local_88;
  undefined6 uStack_80;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  value_type_conflict local_68 [8];
  value_type_conflict local_48 [2];
  value_type_conflict avStack_40 [4];
  
  iVar12 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar12 != 0x10) {
    if (iVar12 == 10) {
      uVar4 = *(undefined8 *)this;
      local_68[0] = (value_type_conflict)uVar4;
      local_68[1] = SUB84(uVar4,4);
      uVar6 = local_68._0_8_;
      local_68._8_8_ = *(undefined8 *)(this + 8);
      local_88 = 0;
      uStack_80 = 0;
      uStack_7a = 0;
      uStack_79 = 0;
      local_a8[0x10] = 0;
      local_a8[0x11] = 0;
      local_a8[0x12] = 0;
      local_a8[0x13] = 0;
      local_a8[0x14] = 0;
      local_a8[0x15] = 0;
      local_a8[0x16] = 0;
      local_a8[0x17] = 0;
      local_a8[0x18] = 0;
      local_a8[0x19] = 0;
      local_a8[0x1a] = 0;
      local_a8[0x1b] = 0;
      local_a8[0x1c] = 0;
      local_a8[0x1d] = 0;
      local_a8[0x1e] = 0;
      local_a8[0x1f] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[8] = 0;
      local_a8[9] = 0;
      local_a8[10] = 0;
      local_a8[0xb] = 0;
      local_a8[0xc] = 0;
      local_a8[0xd] = 0;
      local_a8[0xe] = 0;
      local_a8[0xf] = 0;
      local_68[0] = (value_type_conflict)uVar4;
      if (local_68[0] == 0) {
        lVar7 = 4;
        do {
          lVar11 = lVar7;
          if (lVar11 == 0x10) goto LAB_0013c316;
          lVar7 = lVar11 + 4;
        } while (*(int *)((long)local_68 + lVar11) == 0);
        if (lVar11 == 0x10) {
LAB_0013c316:
          uStack_7a = 0x30;
          uVar9 = 0x2e;
LAB_0013c320:
          if (show_pos && 0 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            local_a8[uVar9 & 0xffffffff] = 0x2b;
          }
          if (field_width != 0) {
            lVar7 = 0;
            if (field_width < 0x30) {
              lVar7 = 0x2f - field_width;
            }
            while (lVar7 < (long)uVar9) {
              uVar9 = uVar9 - 1;
              local_a8[uVar9 & 0xffffffff] = fill_char_str;
            }
          }
          uStack_79 = 0;
          lVar7 = 0;
          do {
            bVar2 = local_a8[lVar7 + uVar9];
            str_result[lVar7] = bVar2;
            lVar7 = lVar7 + 1;
          } while (bVar2 != 0);
          return true;
        }
      }
      uVar9 = 0x2f;
      local_68._0_8_ = uVar6;
      do {
        uVar4 = local_68._8_8_;
        if (local_68[0] == 0) {
          lVar7 = 4;
          do {
            bVar15 = lVar7 == 0x10;
            if (bVar15) break;
            piVar1 = (int *)((long)local_68 + lVar7);
            lVar7 = lVar7 + 4;
          } while (*piVar1 == 0);
        }
        else {
          bVar15 = false;
        }
        if ((uVar9 == 0) || (bVar15)) goto LAB_0013c320;
        local_48[0] = local_68[0];
        local_48[1] = local_68[1];
        avStack_40[0] = local_68[2];
        avStack_40[1] = local_68[3];
        lVar7 = 0xc;
        uVar13 = 0;
        uVar10 = 0;
        do {
          uVar10 = CONCAT44((int)uVar10 + (int)uVar13 * -10,*(undefined4 *)((long)local_68 + lVar7))
          ;
          uVar13 = uVar10 / 10;
          *(int *)((long)local_68 + lVar7) = (int)uVar13;
          uVar6 = local_68._8_8_;
          lVar7 = lVar7 + -4;
        } while (lVar7 != -4);
        local_68[4] = local_68[0];
        local_68[5] = local_68[1];
        local_68[6] = local_68[2];
        local_68[7] = local_68[3];
        lVar7 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 + (ulong)local_68[lVar7 + 4] * 10;
          local_68[lVar7 + 4] = (value_type_conflict)uVar10;
          uVar10 = uVar10 >> 0x20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_b8.values.super_array<unsigned_int,_4UL>.elems[0] = local_68[0];
        local_b8.values.super_array<unsigned_int,_4UL>.elems[1] = local_68[1];
        local_68[2] = (value_type_conflict)uVar4;
        local_68[3] = SUB84(uVar4,4);
        local_b8.values.super_array<unsigned_int,_4UL>.elems[2] = local_68[2];
        local_b8.values.super_array<unsigned_int,_4UL>.elems[3] = local_68[3];
        lVar7 = 0;
        bVar15 = false;
        do {
          uVar10 = ((ulong)local_b8.values.super_array<unsigned_int,_4UL>.elems[lVar7] -
                   (ulong)bVar15) - (ulong)local_68[lVar7 + 4];
          local_b8.values.super_array<unsigned_int,_4UL>.elems[lVar7] = (value_type_conflict)uVar10;
          bVar15 = uVar10 >> 0x20 != 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        local_68._8_8_ = uVar6;
        local_a8[uVar9 - 1 & 0xffffffff] =
             (byte)local_b8.values.super_array<unsigned_int,_4UL>.elems[0] + 0x30;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    if (iVar12 != 8) {
      return false;
    }
    uVar4 = *(undefined8 *)this;
    local_b8.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
    local_b8.values.super_array<unsigned_int,_4UL>.elems[1] = SUB84(uVar4,4);
    local_b8.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(this + 8);
    local_88 = 0;
    uStack_80 = 0;
    uStack_7a = 0;
    local_a8[0x10] = 0;
    local_a8[0x11] = 0;
    local_a8[0x12] = 0;
    local_a8[0x13] = 0;
    local_a8[0x14] = 0;
    local_a8[0x15] = 0;
    local_a8[0x16] = 0;
    local_a8[0x17] = 0;
    local_a8[0x18] = 0;
    local_a8[0x19] = 0;
    local_a8[0x1a] = 0;
    local_a8[0x1b] = 0;
    local_a8[0x1c] = 0;
    local_a8[0x1d] = 0;
    local_a8[0x1e] = 0;
    local_a8[0x1f] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_a8[8] = 0;
    local_a8[9] = 0;
    local_a8[10] = 0;
    local_a8[0xb] = 0;
    local_a8[0xc] = 0;
    local_a8[0xd] = 0;
    local_a8[0xe] = 0;
    local_a8[0xf] = 0;
    uStack_79 = 0;
    uStack_78 = 0;
    uStack_77 = 0;
    uStack_76 = 0;
    local_b8.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
    vVar5 = local_b8.values.super_array<unsigned_int,_4UL>.elems[0];
    if (local_b8.values.super_array<unsigned_int,_4UL>.elems[0] == 0) {
      lVar7 = 4;
      do {
        lVar11 = lVar7;
        if (lVar11 == 0x10) goto LAB_0013c44e;
        lVar7 = lVar11 + 4;
      } while (*(int *)((long)local_b8.values.super_array<unsigned_int,_4UL>.elems + lVar11) == 0);
      if (lVar11 == 0x10) {
LAB_0013c44e:
        uStack_77 = 0x30;
        uVar9 = 0x31;
LAB_0013c458:
        if (show_base && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_a8[uVar9 & 0xffffffff] = 0x30;
        }
        if (show_pos && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_a8[uVar9 & 0xffffffff] = 0x2b;
        }
        if (field_width != 0) {
          lVar7 = 0;
          if (field_width < 0x33) {
            lVar7 = 0x32 - field_width;
          }
          while (lVar7 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            local_a8[uVar9 & 0xffffffff] = fill_char_str;
          }
        }
        uStack_76 = 0;
        lVar7 = 0;
        do {
          bVar2 = local_a8[lVar7 + uVar9];
          str_result[lVar7] = bVar2;
          lVar7 = lVar7 + 1;
        } while (bVar2 != 0);
        return true;
      }
    }
    uVar9 = 0x32;
    do {
      if (vVar5 == 0) {
        lVar7 = 4;
        do {
          bVar15 = lVar7 == 0x10;
          if (bVar15) break;
          piVar1 = (int *)((long)local_b8.values.super_array<unsigned_int,_4UL>.elems + lVar7);
          lVar7 = lVar7 + 4;
        } while (*piVar1 == 0);
      }
      else {
        bVar15 = false;
      }
      uVar10 = uVar9 - 1;
      if ((uVar9 == 0) || (bVar15)) goto LAB_0013c458;
      local_b8.values.super_array<unsigned_int,_4UL>.elems[0]._0_1_ = (byte)uVar4;
      local_a8[uVar10 & 0xffffffff] =
           (byte)local_b8.values.super_array<unsigned_int,_4UL>.elems[0] & 7 | 0x30;
      uVar14 = 0;
      lVar7 = 0xc;
      do {
        uVar3 = *(uint *)((long)local_b8.values.super_array<unsigned_int,_4UL>.elems + lVar7);
        *(uint *)((long)local_b8.values.super_array<unsigned_int,_4UL>.elems + lVar7) =
             uVar3 >> 3 | uVar14;
        uVar14 = uVar3 << 0x1d;
        lVar7 = lVar7 + -4;
        uVar9 = uVar10;
      } while (lVar7 != -4);
    } while( true );
  }
  uVar4 = *(undefined8 *)this;
  local_b8.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
  local_b8.values.super_array<unsigned_int,_4UL>.elems[1] = SUB84(uVar4,4);
  uVar6 = local_b8.values.super_array<unsigned_int,_4UL>.elems._0_8_;
  local_b8.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_88 = 0;
  local_b8.values.super_array<unsigned_int,_4UL>.elems[0] = (value_type_conflict)uVar4;
  if (local_b8.values.super_array<unsigned_int,_4UL>.elems[0] == 0) {
    lVar7 = 4;
    do {
      lVar11 = lVar7;
      if (lVar11 == 0x10) goto LAB_0013c39f;
      lVar7 = lVar11 + 4;
    } while (*(int *)((long)local_b8.values.super_array<unsigned_int,_4UL>.elems + lVar11) == 0);
    if (lVar11 == 0x10) {
LAB_0013c39f:
      local_88 = 0x30000000000000;
      uVar9 = 0x26;
      goto LAB_0013c3a9;
    }
  }
  local_b8.values.super_array<unsigned_int,_4UL>.elems._0_8_ = uVar6;
  uVar8 = uintwide_t<128U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                    (&local_b8,(char *)((long)&local_88 + 7),is_uppercase);
  uVar9 = 0x27 - uVar8;
LAB_0013c3a9:
  if ((show_base) && (1 < (long)uVar9)) {
    local_a8[(int)uVar9 - 1] = !is_uppercase << 5 | 0x58;
    uVar9 = uVar9 - 2;
    local_a8[uVar9 & 0xffffffff] = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar9)) {
    uVar9 = uVar9 - 1;
    local_a8[uVar9 & 0xffffffff] = 0x2b;
  }
  if (field_width != 0) {
    lVar7 = 0;
    if (field_width < 0x28) {
      lVar7 = 0x27 - field_width;
    }
    while (lVar7 < (long)uVar9) {
      uVar9 = uVar9 - 1;
      local_a8[uVar9 & 0xffffffff] = fill_char_str;
    }
  }
  local_88 = local_88 & 0xffffffffffffff;
  lVar7 = 0;
  do {
    bVar2 = local_a8[lVar7 + uVar9];
    str_result[lVar7] = bVar2;
    lVar7 = lVar7 + 1;
  } while (bVar2 != 0);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }